

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O3

bool perfetto::anon_unknown_4::NameMatchesFilter
               (string *name,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *name_filter,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *name_regex_filter)

{
  pointer pbVar1;
  pointer pbVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  bool bVar5;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var6;
  long lVar7;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __it;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var8;
  long lVar9;
  
  pbVar1 = (name_filter->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (name_filter->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if ((pbVar1 == pbVar2) &&
     ((name_regex_filter->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start ==
      (name_regex_filter->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish)) {
    return true;
  }
  _Var6 = ::std::
          __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                    (pbVar1,pbVar2,name);
  pbVar3 = (name_filter->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  __it._M_current =
       (name_regex_filter->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  pbVar4 = (name_regex_filter->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  lVar9 = (long)pbVar4 - (long)__it._M_current;
  if (0 < lVar9 >> 7) {
    lVar7 = (lVar9 >> 7) + 1;
    do {
      bVar5 = __gnu_cxx::__ops::
              _Iter_pred<perfetto::(anonymous_namespace)::NameMatchesFilter(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::$_0>
              ::operator()((_Iter_pred<perfetto::(anonymous_namespace)::NameMatchesFilter(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::__0>
                            *)name,__it);
      _Var8._M_current = __it._M_current;
      if (bVar5) goto LAB_002b43e1;
      bVar5 = __gnu_cxx::__ops::
              _Iter_pred<perfetto::(anonymous_namespace)::NameMatchesFilter(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::$_0>
              ::operator()((_Iter_pred<perfetto::(anonymous_namespace)::NameMatchesFilter(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::__0>
                            *)name,__it._M_current + 1);
      _Var8._M_current = __it._M_current + 1;
      if (bVar5) goto LAB_002b43e1;
      bVar5 = __gnu_cxx::__ops::
              _Iter_pred<perfetto::(anonymous_namespace)::NameMatchesFilter(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::$_0>
              ::operator()((_Iter_pred<perfetto::(anonymous_namespace)::NameMatchesFilter(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::__0>
                            *)name,__it._M_current + 2);
      _Var8._M_current = __it._M_current + 2;
      if (bVar5) goto LAB_002b43e1;
      bVar5 = __gnu_cxx::__ops::
              _Iter_pred<perfetto::(anonymous_namespace)::NameMatchesFilter(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::$_0>
              ::operator()((_Iter_pred<perfetto::(anonymous_namespace)::NameMatchesFilter(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::__0>
                            *)name,__it._M_current + 3);
      _Var8._M_current = __it._M_current + 3;
      if (bVar5) goto LAB_002b43e1;
      __it._M_current = __it._M_current + 4;
      lVar7 = lVar7 + -1;
      lVar9 = lVar9 + -0x80;
    } while (1 < lVar7);
  }
  lVar9 = lVar9 >> 5;
  if (lVar9 != 1) {
    if (lVar9 != 2) {
      _Var8._M_current = pbVar4;
      if ((lVar9 != 3) ||
         (bVar5 = __gnu_cxx::__ops::
                  _Iter_pred<perfetto::(anonymous_namespace)::NameMatchesFilter(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::$_0>
                  ::operator()((_Iter_pred<perfetto::(anonymous_namespace)::NameMatchesFilter(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::__0>
                                *)name,__it), _Var8._M_current = __it._M_current, bVar5))
      goto LAB_002b43e1;
      __it._M_current = __it._M_current + 1;
    }
    bVar5 = __gnu_cxx::__ops::
            _Iter_pred<perfetto::(anonymous_namespace)::NameMatchesFilter(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::$_0>
            ::operator()((_Iter_pred<perfetto::(anonymous_namespace)::NameMatchesFilter(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::__0>
                          *)name,__it);
    _Var8._M_current = __it._M_current;
    if (bVar5) goto LAB_002b43e1;
    __it._M_current = __it._M_current + 1;
  }
  bVar5 = __gnu_cxx::__ops::
          _Iter_pred<perfetto::(anonymous_namespace)::NameMatchesFilter(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::$_0>
          ::operator()((_Iter_pred<perfetto::(anonymous_namespace)::NameMatchesFilter(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::__0>
                        *)name,__it);
  _Var8._M_current = pbVar4;
  if (bVar5) {
    _Var8._M_current = __it._M_current;
  }
LAB_002b43e1:
  return _Var8._M_current !=
         (name_regex_filter->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_finish || _Var6._M_current != pbVar3;
}

Assistant:

bool NameMatchesFilter(const std::string& name,
                       const std::vector<std::string>& name_filter,
                       const std::vector<std::string>& name_regex_filter) {
  bool filter_is_set = !name_filter.empty() || !name_regex_filter.empty();
  if (!filter_is_set)
    return true;
  bool filter_matches = std::find(name_filter.begin(), name_filter.end(),
                                  name) != name_filter.end();
  bool filter_regex_matches =
      std::find_if(name_regex_filter.begin(), name_regex_filter.end(),
                   [&](const std::string& regex) {
                     return std::regex_match(
                         name, std::regex(regex, std::regex::extended));
                   }) != name_regex_filter.end();
  return filter_matches || filter_regex_matches;
}